

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionMetadata.cpp
# Opt level: O3

bool Js::JavascriptExceptionMetadata::PopulateMetadataFromException
               (Var metadata,JavascriptExceptionObject *recordedException,
               ScriptContext *scriptContext)

{
  LPCUTF8 puVar1;
  byte bVar2;
  Type TVar3;
  code *pcVar4;
  Var instance;
  ULONG UVar5;
  bool bVar6;
  char16 cVar7;
  uint32 uVar8;
  charcount_t cVar9;
  charcount_t cVar10;
  uint uVar11;
  FunctionBody *this;
  LineOffsetCache *this_00;
  uint64 uVar12;
  uint64 uVar13;
  undefined4 *puVar14;
  LPCWSTR content;
  JavascriptString *pJVar15;
  LPCUTF8 puVar16;
  ulong uVar17;
  char16 *buffer;
  int iVar18;
  uint uVar19;
  Utf8SourceInfo *pUVar20;
  BufferStringBuilder local_78;
  BufferStringBuilder builder;
  charcount_t startByteOffset;
  LPCUTF8 local_60;
  LPCUTF8 functionStart;
  Var local_50;
  LONG local_44;
  ULONG local_40;
  LONG column;
  ULONG line;
  
  TVar3 = (recordedException->exceptionContext).m_throwingFunctionByteCodeOffset;
  functionStart = (LPCUTF8)scriptContext;
  local_50 = metadata;
  this = JavascriptExceptionObject::GetFunctionBody(recordedException);
  if (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8 &
       4) != 0) ||
     (bVar6 = FunctionBody::GetLineCharOffset(this,TVar3,&local_40,&local_44,true), !bVar6)) {
    local_40 = 0;
    local_44 = 0;
  }
  pUVar20 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  Utf8SourceInfo::EnsureLineOffsetCache(pUVar20);
  this_00 = Utf8SourceInfo::GetLineOffsetCache(pUVar20);
  UVar5 = local_40;
  uVar8 = LineOffsetCache::GetLineCount(this_00);
  if ((UVar5 < uVar8) && (uVar19 = local_40 + 1, uVar19 != 0)) {
    _line = (Utf8SourceInfo *)(double)local_40;
    uVar12 = NumberUtilities::ToSpecial((double)_line);
    bVar6 = NumberUtilities::IsNan((double)_line);
    if ((bVar6) &&
       ((uVar13 = NumberUtilities::ToSpecial((double)_line), uVar13 != 0xfff8000000000000 &&
        (uVar13 = NumberUtilities::ToSpecial((double)_line), uVar13 != 0x7ff8000000000000)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      _line = (Utf8SourceInfo *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)
       &(_line->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar6) goto LAB_00bc2c93;
      *(undefined4 *)
       &(_line->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           0;
    }
    JavascriptOperators::OP_SetProperty
              (local_50,0xf7,(Var)(uVar12 ^ 0xfffc000000000000),(ScriptContext *)functionStart,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
    _line = (Utf8SourceInfo *)(double)local_44;
    uVar12 = NumberUtilities::ToSpecial((double)_line);
    bVar6 = NumberUtilities::IsNan((double)_line);
    if (((bVar6) &&
        (uVar13 = NumberUtilities::ToSpecial((double)_line), uVar13 != 0xfff8000000000000)) &&
       (uVar13 = NumberUtilities::ToSpecial((double)_line), uVar13 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      _line = (Utf8SourceInfo *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)
       &(_line->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar6) goto LAB_00bc2c93;
      *(undefined4 *)
       &(_line->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           0;
    }
    _line = pUVar20;
    JavascriptOperators::OP_SetProperty
              (local_50,0x2d2,(Var)(uVar12 ^ 0xfffc000000000000),(ScriptContext *)functionStart,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
    uVar12 = NumberUtilities::ToSpecial(0.0);
    bVar6 = NumberUtilities::IsNan(0.0);
    if (((bVar6) && (uVar13 = NumberUtilities::ToSpecial(0.0), uVar13 != 0xfff8000000000000)) &&
       (uVar13 = NumberUtilities::ToSpecial(0.0), uVar13 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar6) goto LAB_00bc2c93;
      *puVar14 = 0;
    }
    instance = local_50;
    puVar16 = functionStart;
    JavascriptOperators::OP_SetProperty
              (local_50,0xd1,(Var)(uVar12 ^ 0xfffc000000000000),(ScriptContext *)functionStart,
               (PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0);
    content = ParseableFunctionInfo::GetSourceName(&this->super_ParseableFunctionInfo);
    pJVar15 = JavascriptString::NewCopySz(content,(ScriptContext *)puVar16);
    JavascriptOperators::OP_SetProperty
              (instance,0x2d3,pJVar15,(ScriptContext *)puVar16,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    puVar16 = Utf8SourceInfo::GetSource
                        (_line,L"Jsrt::JsExperimentalGetAndClearExceptionWithMetadata");
    builder.m_string._4_4_ = 0;
    column = 0;
    cVar9 = LineOffsetCache::GetCharacterOffsetForLine
                      (this_00,local_40,(charcount_t *)((long)&builder.m_string + 4));
    uVar8 = LineOffsetCache::GetLineCount(this_00);
    if (uVar19 < uVar8) {
      cVar10 = LineOffsetCache::GetCharacterOffsetForLine(this_00,uVar19,(charcount_t *)&column);
      pUVar20 = _line;
      uVar19 = column - 1;
      uVar17 = (ulong)uVar19;
      if (puVar16[uVar17] == '\n') {
        iVar18 = cVar10 - 1;
        if ((uVar19 != 0) && (puVar16[column - 2U] == '\r')) {
          iVar18 = cVar10 - 2;
          uVar19 = column - 2U;
        }
      }
      else {
        local_78.m_string._0_4_ = 1;
        puVar1 = puVar16 + (uint)column;
        local_60 = puVar16 + ((ulong)(uint)column - 3);
        if (local_60 < puVar1) {
          local_60 = puVar1 + -2;
          bVar2 = puVar1[-3];
          cVar7 = (char16)bVar2;
          if ((char)bVar2 < '\0') {
            cVar7 = utf8::DecodeTail((ushort)bVar2,&local_60,puVar1,(DecodeOptions *)&local_78,
                                     (bool *)0x0);
          }
          if ((cVar7 & 0xfffeU) != 0x2028) {
            uVar19 = column - 1;
            uVar17 = (ulong)uVar19;
            goto LAB_00bc2b96;
          }
          uVar19 = column - 3;
        }
        else {
LAB_00bc2b96:
          if (puVar16[uVar17] != '\r') {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExceptionMetadata.cpp"
                                        ,0x93,"(0)",
                                        "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine"
                                       );
            if (!bVar6) {
LAB_00bc2c93:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar14 = 0;
            goto LAB_00bc27b2;
          }
        }
        iVar18 = cVar10 - 1;
      }
    }
    else {
      TVar3 = (this->super_ParseableFunctionInfo).m_cbLength;
      cVar10 = ParseableFunctionInfo::StartInDocument(&this->super_ParseableFunctionInfo);
      column = cVar10 + TVar3;
      TVar3 = (this->super_ParseableFunctionInfo).m_cchLength;
      uVar11 = ParseableFunctionInfo::StartOffset(&this->super_ParseableFunctionInfo);
      iVar18 = uVar11 + TVar3;
      pUVar20 = _line;
      uVar19 = column;
    }
    column = uVar19;
    puVar1 = functionStart;
    local_60 = puVar16 + builder.m_string._4_4_;
    local_78.m_string =
         BufferStringBuilder::WritableString::New(iVar18 - cVar9,(ScriptContext *)functionStart);
    uVar19 = *(uint *)&pUVar20->field_0xa8;
    BufferStringBuilder::DbgAssertNotFrozen(&local_78);
    buffer = JavascriptString::UnsafeGetBuffer(&(local_78.m_string)->super_JavascriptString);
    utf8::DecodeUnitsInto
              (buffer,&local_60,puVar16 + (uint)column,uVar19 >> 1 & doAllowThreeByteSurrogates,
               (bool *)0x0);
    pJVar15 = BufferStringBuilder::ToString(&local_78);
    JavascriptOperators::OP_SetProperty
              (local_50,0x153,pJVar15,(ScriptContext *)puVar1,(PropertyValueInfo *)0x0,
               PropertyOperation_None,(Var)0x0);
    bVar6 = true;
  }
  else {
LAB_00bc27b2:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool JavascriptExceptionMetadata::PopulateMetadataFromException(Var metadata, JavascriptExceptionObject * recordedException, ScriptContext * scriptContext) {
        uint32 offset = recordedException->GetByteCodeOffset();
        FunctionBody * functionBody = recordedException->GetFunctionBody();
        ULONG line;
        LONG column;
        if (functionBody->GetUtf8SourceInfo()->GetIsLibraryCode() ||
            !functionBody->GetLineCharOffset(offset, &line, &column)) {
            line = 0;
            column = 0;
        }

        Js::Utf8SourceInfo* sourceInfo = functionBody->GetUtf8SourceInfo();
        sourceInfo->EnsureLineOffsetCache();
        LineOffsetCache *cache = sourceInfo->GetLineOffsetCache();

        if (line >= cache->GetLineCount())
        {
            return false;
        }

        uint32 nextLine;
        if (UInt32Math::Add(line, 1, &nextLine))
        {
            // Overflowed
            return false;
        }

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::line,
            Js::JavascriptNumber::New(line, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::column,
            Js::JavascriptNumber::New(column, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::length,
            Js::JavascriptNumber::New(0, scriptContext), scriptContext);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::url,
            Js::JavascriptString::NewCopySz(functionBody->GetSourceName(), scriptContext), scriptContext);

        LPCUTF8 functionSource = sourceInfo->GetSource(_u("Jsrt::JsExperimentalGetAndClearExceptionWithMetadata"));

        charcount_t startByteOffset = 0;
        charcount_t endByteOffset = 0;
        charcount_t startCharOffset = 0;
        charcount_t endCharOffset = 0;

        
        startCharOffset = cache->GetCharacterOffsetForLine(line, &startByteOffset);

        if (nextLine >= cache->GetLineCount())
        {
            endByteOffset = functionBody->LengthInBytes() + functionBody->StartInDocument();
            endCharOffset = functionBody->LengthInChars() + functionBody->StartOffset();
        }
        else
        {
            endCharOffset = cache->GetCharacterOffsetForLine(nextLine, &endByteOffset);

            // The offsets above point to the start of the following line,
            // while we need to find the end of the current line.
            // To do so, just step back over the preceeding newline character(s)
            if (functionSource[endByteOffset - 1] == _u('\n'))
            {
                endCharOffset--;
                endByteOffset--;
                // This may have been \r\n
                if (endByteOffset > 0 && functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
            }
            else
            {
                utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;
                LPCUTF8 potentialNewlineStart = functionSource + endByteOffset - 3;
                char16 decodedCharacter = utf8::Decode(potentialNewlineStart, functionSource + endByteOffset, options);
                if (decodedCharacter == 0x2028 || decodedCharacter == 0x2029)
                {
                    endCharOffset--;
                    endByteOffset -= 3;
                }
                else if (functionSource[endByteOffset - 1] == _u('\r'))
                {
                    endCharOffset--;
                    endByteOffset--;
                }
                else
                {
                    AssertMsg(FALSE, "Line ending logic out of sync between Js::JavascriptExceptionMetadata and Js::LineOffsetCache::GetCharacterOffsetForLine");
                    return false;
                }
            }
        }

        LPCUTF8 functionStart = functionSource + startByteOffset;

        Js::BufferStringBuilder builder(endCharOffset - startCharOffset, scriptContext);
        utf8::DecodeOptions options = sourceInfo->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
        utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), functionStart, functionSource + endByteOffset, options);

        Js::JavascriptOperators::OP_SetProperty(metadata, Js::PropertyIds::source,
            builder.ToString(), scriptContext);

        return true;
    }